

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O2

void drawImage6(Array2D<GZ> *px,int w,int h)

{
  GZ *this;
  double dVar1;
  uint uVar2;
  ulong uVar3;
  int i;
  int iVar4;
  int x;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int j;
  int iVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  double local_90;
  
  uVar7 = 0;
  uVar6 = (ulong)(uint)w;
  if (w < 1) {
    uVar6 = uVar7;
  }
  uVar3 = (ulong)(uint)h;
  if (h < 1) {
    uVar3 = uVar7;
  }
  for (; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      this = px->_data + px->_sizeY * uVar7 + uVar5;
      Imath_3_2::half::operator=(&this->g,0.0);
      this->z = 0.0;
      local_90 = 0.0;
      for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
        dVar9 = 0.0;
        for (iVar8 = 0; iVar8 != 3; iVar8 = iVar8 + 1) {
          uVar2 = 0;
          dVar12 = 0.0;
          dVar1 = 0.0;
          dVar13 = 0.0;
          while ((uVar2 < 0x100 && (dVar13 < 100.0))) {
            dVar13 = dVar12 * dVar12 - dVar1 * dVar1;
            dVar1 = dVar1 * (dVar12 + dVar12) +
                    (dVar9 * 0.3333333432674408 + (double)(int)uVar7) *
                    ((((double)h * 3.5) / (double)w + -1.3333 + 1.3333) / (double)h) + -1.3333;
            dVar12 = (local_90 * 0.3333333432674408 + (double)(int)uVar5) * (3.5 / (double)w) + -2.5
                     + dVar13;
            uVar2 = uVar2 + 1;
          }
          fVar10 = (float)(int)uVar2 * 0.00390625 * 5.0;
          fVar11 = (fVar10 - (float)(int)fVar10) + (fVar10 - (float)(int)fVar10);
          Imath_3_2::half::operator+=
                    (&this->g,(float)(~-(uint)(fVar11 < 1.0) & (uint)(2.0 - fVar11) |
                                     (uint)fVar11 & -(uint)(fVar11 < 1.0)) * 4.0);
          this->z = fVar10;
          dVar9 = dVar9 + 1.0;
        }
        local_90 = local_90 + 1.0;
      }
      Imath_3_2::half::operator*=(&this->g,0.11111112);
      this->z = this->z * 0.11111112;
    }
  }
  return;
}

Assistant:

void
drawImage6 (Array2D<GZ>& px, int w, int h)
{
    mndl (px, w, h, 0, w, 0, h, 3, 3, -2.5, 1.0, -1.3333, 1, 0, 0);
}